

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRGraphicsWindowNode.cpp
# Opt level: O3

void __thiscall
MinVR::VRGraphicsWindowNode::VRGraphicsWindowNode
          (VRGraphicsWindowNode *this,string *name,VRGraphicsToolkit *gfxToolkit,
          VRWindowToolkit *winToolkit,VRWindowSettings *settings)

{
  size_t *psVar1;
  pointer pcVar2;
  VRWindowToolkit *pVVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined3 uVar13;
  bool bVar14;
  bool bVar15;
  undefined2 uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  _List_node_base *p_Var21;
  _List_node_base *local_b8;
  _List_node_base *local_b0;
  _List_node_base local_a8;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  undefined1 local_88;
  long *local_80 [2];
  long local_70 [2];
  undefined4 local_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int iStack_48;
  int local_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int iStack_38;
  
  VRDisplayNode::VRDisplayNode(&this->super_VRDisplayNode,name);
  (this->super_VRDisplayNode)._vptr_VRDisplayNode =
       (_func_int **)&PTR__VRGraphicsWindowNode_00177610;
  this->_gfxToolkit = gfxToolkit;
  this->_winToolkit = winToolkit;
  iVar20 = settings->ypos;
  iVar4 = settings->width;
  iVar5 = settings->height;
  (this->_settings).xpos = settings->xpos;
  (this->_settings).ypos = iVar20;
  (this->_settings).width = iVar4;
  (this->_settings).height = iVar5;
  (this->_settings).border = settings->border;
  (this->_settings).caption._M_dataplus._M_p = (pointer)&(this->_settings).caption.field_2;
  pcVar2 = (settings->caption)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_settings).caption,pcVar2,
             pcVar2 + (settings->caption)._M_string_length);
  bVar14 = settings->quadBuffered;
  bVar15 = settings->visible;
  uVar16 = *(undefined2 *)&settings->field_0x3a;
  iVar17 = settings->sharedContextGroupID;
  iVar18 = settings->contextVersionMajor;
  iVar19 = settings->contextVersionMinor;
  iVar20 = settings->rgbBits;
  iVar4 = settings->alphaBits;
  iVar5 = settings->depthBits;
  iVar6 = settings->stencilBits;
  bVar8 = settings->fullScreen;
  bVar9 = settings->resizable;
  bVar10 = settings->allowMaximize;
  bVar11 = settings->gpuAffinity;
  bVar12 = settings->debugContext;
  uVar13 = *(undefined3 *)&settings->field_0x5d;
  iVar7 = settings->msaaSamples;
  (this->_settings).stencilBits = settings->stencilBits;
  (this->_settings).fullScreen = bVar8;
  (this->_settings).resizable = bVar9;
  (this->_settings).allowMaximize = bVar10;
  (this->_settings).gpuAffinity = bVar11;
  (this->_settings).debugContext = bVar12;
  *(undefined3 *)&(this->_settings).field_0x5d = uVar13;
  (this->_settings).msaaSamples = iVar7;
  (this->_settings).rgbBits = iVar20;
  (this->_settings).alphaBits = iVar4;
  (this->_settings).depthBits = iVar5;
  (this->_settings).stencilBits = iVar6;
  (this->_settings).quadBuffered = bVar14;
  (this->_settings).visible = bVar15;
  *(undefined2 *)&(this->_settings).field_0x3a = uVar16;
  (this->_settings).sharedContextGroupID = iVar17;
  (this->_settings).contextVersionMajor = iVar18;
  (this->_settings).contextVersionMinor = iVar19;
  pVVar3 = this->_winToolkit;
  local_88 = (this->_settings).border;
  local_98 = (this->_settings).xpos;
  iStack_94 = (this->_settings).ypos;
  iStack_90 = (this->_settings).width;
  iStack_8c = (this->_settings).height;
  pcVar2 = (this->_settings).caption._M_dataplus._M_p;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar2,pcVar2 + (this->_settings).caption._M_string_length);
  local_60._0_1_ = (this->_settings).quadBuffered;
  local_60._1_1_ = (this->_settings).visible;
  local_60._2_2_ = *(undefined2 *)&(this->_settings).field_0x3a;
  iStack_5c = (this->_settings).sharedContextGroupID;
  iStack_58 = (this->_settings).contextVersionMajor;
  iStack_54 = (this->_settings).contextVersionMinor;
  iStack_50 = (this->_settings).rgbBits;
  iStack_4c = (this->_settings).alphaBits;
  iStack_48 = (this->_settings).depthBits;
  local_44 = (this->_settings).stencilBits;
  uStack_40._0_1_ = (this->_settings).fullScreen;
  uStack_40._1_1_ = (this->_settings).resizable;
  uStack_40._2_1_ = (this->_settings).allowMaximize;
  uStack_40._3_1_ = (this->_settings).gpuAffinity;
  uStack_3c = *(undefined4 *)&(this->_settings).debugContext;
  iStack_38 = (this->_settings).msaaSamples;
  iVar20 = (**(code **)(*(long *)pVVar3 + 0x18))(pVVar3);
  this->_windowID = iVar20;
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
    iVar20 = this->_windowID;
  }
  (**(code **)(*(long *)this->_winToolkit + 0x38))
            (this->_winToolkit,iVar20,&this->_framebufferWidth,&this->_framebufferHeight);
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"WindowX","");
  p_Var21 = (_List_node_base *)operator_new(0x30);
  p_Var21[1]._M_next = p_Var21 + 2;
  if (local_b8 == &local_a8) {
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
    p_Var21[2]._M_prev = local_a8._M_prev;
  }
  else {
    p_Var21[1]._M_next = local_b8;
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
  }
  p_Var21[1]._M_prev = local_b0;
  local_b0 = (_List_node_base *)0x0;
  local_a8._M_next._0_1_ = 0;
  local_b8 = &local_a8;
  std::__detail::_List_node_base::_M_hook(p_Var21);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_) + 1);
  }
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"WindowY","");
  p_Var21 = (_List_node_base *)operator_new(0x30);
  p_Var21[1]._M_next = p_Var21 + 2;
  if (local_b8 == &local_a8) {
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
    p_Var21[2]._M_prev = local_a8._M_prev;
  }
  else {
    p_Var21[1]._M_next = local_b8;
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
  }
  p_Var21[1]._M_prev = local_b0;
  local_b0 = (_List_node_base *)0x0;
  local_a8._M_next._0_1_ = 0;
  local_b8 = &local_a8;
  std::__detail::_List_node_base::_M_hook(p_Var21);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_) + 1);
  }
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"WindowWidth","");
  p_Var21 = (_List_node_base *)operator_new(0x30);
  p_Var21[1]._M_next = p_Var21 + 2;
  if (local_b8 == &local_a8) {
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
    p_Var21[2]._M_prev = local_a8._M_prev;
  }
  else {
    p_Var21[1]._M_next = local_b8;
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
  }
  p_Var21[1]._M_prev = local_b0;
  local_b0 = (_List_node_base *)0x0;
  local_a8._M_next._0_1_ = 0;
  local_b8 = &local_a8;
  std::__detail::_List_node_base::_M_hook(p_Var21);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_) + 1);
  }
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"WindowHeight","");
  p_Var21 = (_List_node_base *)operator_new(0x30);
  p_Var21[1]._M_next = p_Var21 + 2;
  if (local_b8 == &local_a8) {
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
    p_Var21[2]._M_prev = local_a8._M_prev;
  }
  else {
    p_Var21[1]._M_next = local_b8;
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
  }
  p_Var21[1]._M_prev = local_b0;
  local_b0 = (_List_node_base *)0x0;
  local_a8._M_next._0_1_ = 0;
  local_b8 = &local_a8;
  std::__detail::_List_node_base::_M_hook(p_Var21);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_) + 1);
  }
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"FramebufferWidth","");
  p_Var21 = (_List_node_base *)operator_new(0x30);
  p_Var21[1]._M_next = p_Var21 + 2;
  if (local_b8 == &local_a8) {
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
    p_Var21[2]._M_prev = local_a8._M_prev;
  }
  else {
    p_Var21[1]._M_next = local_b8;
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
  }
  p_Var21[1]._M_prev = local_b0;
  local_b0 = (_List_node_base *)0x0;
  local_a8._M_next._0_1_ = 0;
  local_b8 = &local_a8;
  std::__detail::_List_node_base::_M_hook(p_Var21);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_) + 1);
  }
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"FramebufferHeight","");
  p_Var21 = (_List_node_base *)operator_new(0x30);
  p_Var21[1]._M_next = p_Var21 + 2;
  if (local_b8 == &local_a8) {
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
    p_Var21[2]._M_prev = local_a8._M_prev;
  }
  else {
    p_Var21[1]._M_next = local_b8;
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
  }
  p_Var21[1]._M_prev = local_b0;
  local_b0 = (_List_node_base *)0x0;
  local_a8._M_next._0_1_ = 0;
  local_b8 = &local_a8;
  std::__detail::_List_node_base::_M_hook(p_Var21);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_) + 1);
  }
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"SharedContextId","");
  p_Var21 = (_List_node_base *)operator_new(0x30);
  p_Var21[1]._M_next = p_Var21 + 2;
  if (local_b8 == &local_a8) {
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
    p_Var21[2]._M_prev = local_a8._M_prev;
  }
  else {
    p_Var21[1]._M_next = local_b8;
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
  }
  p_Var21[1]._M_prev = local_b0;
  local_b0 = (_List_node_base *)0x0;
  local_a8._M_next._0_1_ = 0;
  local_b8 = &local_a8;
  std::__detail::_List_node_base::_M_hook(p_Var21);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_) + 1);
  }
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"WindowID","");
  p_Var21 = (_List_node_base *)operator_new(0x30);
  p_Var21[1]._M_next = p_Var21 + 2;
  if (local_b8 == &local_a8) {
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
    p_Var21[2]._M_prev = local_a8._M_prev;
  }
  else {
    p_Var21[1]._M_next = local_b8;
    p_Var21[2]._M_next = (_List_node_base *)CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_);
  }
  p_Var21[1]._M_prev = local_b0;
  local_b0 = (_List_node_base *)0x0;
  local_a8._M_next._0_1_ = 0;
  local_b8 = &local_a8;
  std::__detail::_List_node_base::_M_hook(p_Var21);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_next._1_7_,local_a8._M_next._0_1_) + 1);
  }
  return;
}

Assistant:

VRGraphicsWindowNode::VRGraphicsWindowNode(const std::string &name, VRGraphicsToolkit *gfxToolkit, VRWindowToolkit *winToolkit, const VRWindowSettings &settings) : 
  VRDisplayNode(name), _gfxToolkit(gfxToolkit), _winToolkit(winToolkit), _settings(settings)
{
  _windowID = _winToolkit->createWindow(_settings);
  _winToolkit->getFramebufferSize(_windowID, _framebufferWidth, _framebufferHeight);
  _valuesAdded.push_back("WindowX");
  _valuesAdded.push_back("WindowY");
  _valuesAdded.push_back("WindowWidth");
  _valuesAdded.push_back("WindowHeight");
  _valuesAdded.push_back("FramebufferWidth");
  _valuesAdded.push_back("FramebufferHeight");
  _valuesAdded.push_back("SharedContextId");
  _valuesAdded.push_back("WindowID");

}